

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fClippingTests.cpp
# Opt level: O1

int deqp::gles3::Functional::anon_unknown_0::compareImages
              (TestLog *log,ConstPixelBufferAccess *test,ConstPixelBufferAccess *ref,
              PixelBufferAccess *diffMask,int kernelRadius,_func_bool_IVec4_ptr_IVec4_ptr *pixelCmp)

{
  ConstPixelBufferAccess *this;
  ostringstream *poVar1;
  int iVar2;
  int iVar3;
  byte bVar4;
  byte bVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int z;
  int y;
  int radius;
  IVec4 cTest;
  IVec4 cRef;
  int local_22c;
  int local_224;
  int local_220;
  undefined1 local_1d0 [32];
  undefined1 local_1b0 [384];
  
  iVar2 = (test->m_size).m_data[0];
  iVar3 = (test->m_size).m_data[1];
  tcu::clear(diffMask,(Vec4 *)(anonymous_namespace)::MASK_COLOR_OK);
  if (iVar3 < 1) {
    local_22c = -1;
    local_224 = 0;
    local_220 = 0;
  }
  else {
    local_22c = -1;
    this = (ConstPixelBufferAccess *)(local_1d0 + 0x10);
    z = 0;
    local_220 = 0;
    local_224 = 0;
    do {
      if (0 < iVar2) {
        iVar7 = kernelRadius + z;
        iVar8 = z - kernelRadius;
        y = 0;
        do {
          tcu::ConstPixelBufferAccess::getPixelInt((ConstPixelBufferAccess *)local_1b0,(int)ref,y,z)
          ;
          tcu::ConstPixelBufferAccess::getPixelInt
                    ((ConstPixelBufferAccess *)local_1d0,(int)test,y,z);
          bVar6 = (*pixelCmp)((IVec4 *)local_1b0,(IVec4 *)local_1d0);
          if (!bVar6) {
            if ((y < kernelRadius || z < kernelRadius) || iVar3 <= iVar7) {
              bVar6 = false;
            }
            else {
              iVar11 = y + kernelRadius;
              if (iVar11 < iVar2) {
                if (iVar7 < iVar8) {
                  bVar5 = 0;
                }
                else {
                  bVar5 = 0;
                  iVar10 = y - kernelRadius;
                  iVar9 = iVar8;
joined_r0x00645bd6:
                  do {
                    if (iVar10 <= iVar11) {
                      tcu::ConstPixelBufferAccess::getPixelInt(this,(int)test,iVar10,iVar9);
                      bVar6 = (*pixelCmp)((IVec4 *)local_1b0,(IVec4 *)this);
                      if (!bVar6) {
                        iVar10 = iVar10 + 1;
                        goto joined_r0x00645bd6;
                      }
                      bVar5 = 1;
                    }
                    iVar9 = iVar9 + 1;
                    iVar10 = y - kernelRadius;
                  } while (iVar9 <= iVar7);
                }
                if (iVar7 < iVar8) {
                  bVar4 = 0;
                }
                else {
                  bVar4 = 0;
                  iVar9 = y - kernelRadius;
                  iVar10 = iVar8;
joined_r0x00645c44:
                  do {
                    if (iVar9 <= iVar11) {
                      tcu::ConstPixelBufferAccess::getPixelInt(this,(int)ref,iVar9,iVar10);
                      bVar6 = (*pixelCmp)((IVec4 *)local_1d0,(IVec4 *)this);
                      if (!bVar6) {
                        iVar9 = iVar9 + 1;
                        goto joined_r0x00645c44;
                      }
                      bVar4 = 1;
                    }
                    iVar10 = iVar10 + 1;
                    iVar9 = y - kernelRadius;
                  } while (iVar10 <= iVar7);
                }
                bVar6 = (bool)(bVar5 & bVar4 ^ 1);
              }
              else {
                bVar6 = false;
              }
            }
            if (!bVar6) {
              tcu::PixelBufferAccess::setPixel
                        (diffMask,(Vec4 *)(anonymous_namespace)::MASK_COLOR_DEV,y,z,0);
              if (local_22c == -1) {
                local_22c = 0;
              }
              local_224 = local_224 + 1;
            }
            if (bVar6) {
              tcu::PixelBufferAccess::setPixel
                        (diffMask,(Vec4 *)(anonymous_namespace)::MASK_COLOR_FAIL,y,z,0);
              local_220 = local_220 + 1;
              local_22c = 1;
            }
          }
          y = y + 1;
        } while (y != iVar2);
      }
      z = z + 1;
    } while (z != iVar3);
  }
  poVar1 = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::ostream::operator<<(poVar1,local_224);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1," deviating pixel(s) found.",0x1a);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
  poVar1 = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::ostream::operator<<(poVar1,local_220);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1," faulty pixel(s) found.",0x17);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
  if (local_22c != 1) {
    local_220 = local_22c;
  }
  return local_220;
}

Assistant:

inline int compareImages (tcu::TestLog& log, const ConstPixelBufferAccess& test, const ConstPixelBufferAccess& ref, const PixelBufferAccess& diffMask, int kernelRadius, bool (*pixelCmp)(const tcu::IVec4& a, const tcu::IVec4& b))
{
	const int			height				= test.getHeight();
	const int			width				= test.getWidth();
	int					deviatingPixels		= 0;
	int					faultyPixels		= 0;
	int					compareFailed		= -1;

	tcu::clear(diffMask, MASK_COLOR_OK);

	for (int y = 0; y < height; y++)
	{
		for (int x = 0; x < width; x++)
		{
			const tcu::IVec4 cRef	= ref.getPixelInt(x, y);
			const tcu::IVec4 cTest	= test.getPixelInt(x, y);

			// Pixelwise match, no deviation or fault
			if ((*pixelCmp)(cRef, cTest))
				continue;

			// Deviation
			{
				const int radius	= kernelRadius;
				bool foundRef		= false;
				bool foundTest		= false;

				// edges are considered a "deviation" too. The suitable pixel could be "behind" the edge
				if (y < radius || x < radius || y + radius >= height || x + radius >= width)
				{
					foundRef	= true;
					foundTest	= true;
				}
				else
				{
					// find ref
					for (int kY = y - radius; kY <= y + radius; kY++)
					for (int kX = x - radius; kX <= x + radius; kX++)
					{
						if ((*pixelCmp)(cRef, test.getPixelInt(kX, kY)))
						{
							foundRef = true;
							break;
						}
					}

					// find result
					for (int kY = y - radius; kY <= y + radius; kY++)
					for (int kX = x - radius; kX <= x + radius; kX++)
					{
						if ((*pixelCmp)(cTest, ref.getPixelInt(kX, kY)))
						{
							foundTest = true;
							break;
						}
					}
				}

				// A pixel is deviating if the reference color is found inside the kernel and (~= every pixel reference draws must be drawn by the gl too)
				// the result color is found in the reference image inside the kernel         (~= every pixel gl draws must be drawn by the reference too)
				if (foundRef && foundTest)
				{
					diffMask.setPixel(MASK_COLOR_DEV, x, y);
					if (compareFailed == -1)
						compareFailed = 0;
					deviatingPixels++;
					continue;
				}
			}

			diffMask.setPixel(MASK_COLOR_FAIL, x, y);
			faultyPixels++;									// The pixel is faulty if the color is not found
			compareFailed = 1;
		}
	}

	log << TestLog::Message << deviatingPixels	<< " deviating pixel(s) found." << TestLog::EndMessage;
	log << TestLog::Message << faultyPixels		<< " faulty pixel(s) found." << TestLog::EndMessage;

	return (compareFailed == 1 ? faultyPixels : compareFailed);
}